

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::dht_sample_infohashes
          (session_impl *this,endpoint *ep,sha1_hash *target)

{
  dht_tracker *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_38 = (code *)0x0;
    pcStack_30 = (code *)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x28);
    *(session_impl **)local_48._M_unused._0_8_ = this;
    uVar1 = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
    uVar2 = *(undefined8 *)((long)&(ep->impl_).data_ + 0xc);
    uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x14);
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = *(undefined8 *)&(ep->impl_).data_;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x10) = uVar1;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x14) = uVar2;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x1c) = uVar3;
    pcStack_30 = ::std::
                 _Function_handler<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:6212:40)>
                 ::_M_invoke;
    local_38 = ::std::
               _Function_handler<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:6212:40)>
               ::_M_manager;
    libtorrent::dht::dht_tracker::sample_infohashes
              (this_00,ep,target,
               (function<void_(libtorrent::digest32<160L>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_int,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>,_std::vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>)>
                *)&local_48);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}